

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# newtonmin.c
# Opt level: O2

int newton_min_trust(custom_function *funcpt,custom_gradient *funcgrad,double *xi,int N,double *dx,
                    double fsval,double delta,int method,int MAXITER,int *niter,double eps,
                    double gtol,double stol,double *xf)

{
  double dVar1;
  double eps2;
  int iVar2;
  int iVar3;
  double *f;
  double *array;
  double *xi_00;
  double *x;
  double *H;
  double *L;
  double *ioval;
  ulong uVar4;
  char *__format;
  size_t sVar5;
  ulong uVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double *pdVar10;
  
  sVar5 = (long)N * 8;
  f = (double *)malloc(sVar5);
  array = (double *)malloc(sVar5);
  xi_00 = (double *)malloc(sVar5);
  x = (double *)malloc(sVar5);
  sVar5 = sVar5 * (long)N;
  H = (double *)malloc(sVar5);
  L = (double *)malloc(sVar5);
  ioval = (double *)malloc(0x40);
  *niter = 0;
  pow(eps,0.3333333333333333);
  if (eps < 0.0) {
    eps2 = sqrt(eps);
  }
  else {
    eps2 = SQRT(eps);
  }
  *ioval = (double)(~-(ulong)(0.0 < delta) & 0xbff0000000000000 |
                   (ulong)delta & -(ulong)(0.0 < delta));
  uVar4 = 0;
  uVar6 = 0;
  if (0 < N) {
    uVar6 = (ulong)(uint)N;
  }
  for (; uVar6 != uVar4; uVar4 = uVar4 + 1) {
    xi[uVar4] = dx[uVar4] * xi[uVar4];
    dx[uVar4] = 1.0 / dx[uVar4];
  }
  dVar7 = (*funcpt->funcpt)(xi,N,funcpt->params);
  dVar8 = ABS(dVar7);
  iVar3 = 0;
  if (1.79769313486232e+308 <= dVar8) {
    iVar3 = 0xf;
    printf("Program Exiting as the function value exceeds the maximum double value");
  }
  if (NAN(dVar7)) {
    printf("Program Exiting as the function returns NaN");
    iVar3 = 0xf;
  }
  iVar2 = grad_fd(funcpt,funcgrad,xi,N,dx,eps2,f);
  dVar9 = 0.0;
  dVar7 = 0.0;
  for (uVar4 = 0; uVar6 != uVar4; uVar4 = uVar4 + 1) {
    dVar1 = dx[uVar4];
    dVar7 = dVar7 + dVar1 * dVar1;
    dVar9 = dVar9 + dVar1 * xi[uVar4] * dVar1 * xi[uVar4];
  }
  if (dVar7 < 0.0) {
    dVar7 = sqrt(dVar7);
  }
  else {
    dVar7 = SQRT(dVar7);
  }
  if (dVar9 < 0.0) {
    dVar9 = sqrt(dVar9);
  }
  else {
    dVar9 = SQRT(dVar9);
  }
  if (dVar7 <= dVar9) {
    dVar7 = dVar9;
  }
  if (dVar8 <= ABS(fsval)) {
    dVar8 = ABS(fsval);
  }
  for (uVar4 = 0; uVar6 != uVar4; uVar4 = uVar4 + 1) {
    dVar9 = ABS(xi[uVar4]);
    if (ABS(xi[uVar4]) <= 1.0 / ABS(dx[uVar4])) {
      dVar9 = 1.0 / ABS(dx[uVar4]);
    }
    array[uVar4] = (ABS(f[uVar4]) * dVar9) / dVar8;
  }
  if (iVar2 == 0xf) {
    iVar3 = 0xf;
  }
  dVar8 = array_max_abs(array,N);
  if (dVar8 <= gtol * 0.001) {
    iVar3 = 1;
    for (uVar4 = 0; uVar6 != uVar4; uVar4 = uVar4 + 1) {
      xf[uVar4] = xi[uVar4];
    }
  }
  pdVar10 = H;
  iVar2 = hessian_opt(funcpt,funcgrad,xi,N,f,dx,eps,eps2,H);
  for (uVar4 = 0; uVar6 != uVar4; uVar4 = uVar4 + 1) {
    xi_00[uVar4] = xi[uVar4];
  }
  if (iVar2 == 0xf) {
    iVar3 = 0xf;
  }
  do {
    iVar2 = (int)pdVar10;
    if (iVar3 != 0) {
LAB_00125a99:
      for (uVar4 = 0; uVar6 != uVar4; uVar4 = uVar4 + 1) {
        xi[uVar4] = dx[uVar4] * xi[uVar4];
        dx[uVar4] = 1.0 / dx[uVar4];
      }
      free(ioval);
      free(f);
      free(H);
      free(array);
      free(xi_00);
      free(L);
      free(x);
      return iVar3;
    }
    if (MAXITER <= *niter) {
      iVar3 = 4;
      goto LAB_00125a99;
    }
    *niter = *niter + 1;
    modelhess(H,N,dx,eps,L);
    scale(f,1,N,-1.0);
    linsolve_lower(L,N,f,x);
    scale(f,1,N,-1.0);
    if (method == 1) {
      iVar3 = trsrch_ddl(funcpt,xi_00,f,x,N,dx,dVar7 * 1000.0,iVar2,L,H,stol,ioval,xf);
    }
    else {
      if (method != 0) {
        puts("The program accepts only two method values ");
        puts("Method 0 : Hook step ");
        puts("Method 1 : Double Dog Leg Step ");
        exit(1);
      }
      iVar3 = trsrch(funcpt,xi_00,f,x,N,dx,dVar7 * 1000.0,*niter,L,H,stol,ioval,eps,xf);
    }
    dVar8 = (*funcpt->funcpt)(xf,N,funcpt->params);
    if (1.79769313486232e+308 <= ABS(dVar8)) {
      __format = "Program Exiting as the function value exceeds the maximum double value";
LAB_00125a6d:
      printf(__format);
      iVar3 = 0xf;
      goto LAB_00125a99;
    }
    if (NAN(dVar8)) {
      __format = "Program Exiting as the function returns NaN";
      goto LAB_00125a6d;
    }
    iVar2 = grad_fd(funcpt,funcgrad,xf,N,dx,eps2,f);
    if (iVar2 == 0xf) {
      iVar3 = 0xf;
      goto LAB_00125a99;
    }
    iVar3 = stopcheck(dVar8,N,xi_00,xf,f,dx,fsval,gtol,stol,iVar3);
    pdVar10 = H;
    iVar2 = hessian_opt(funcpt,funcgrad,xf,N,f,dx,eps,eps2,H);
    for (uVar4 = 0; uVar6 != uVar4; uVar4 = uVar4 + 1) {
      xi_00[uVar4] = xf[uVar4];
    }
    if (iVar2 == 0xf) {
      iVar3 = 0xf;
    }
  } while( true );
}

Assistant:

int newton_min_trust(custom_function *funcpt, custom_gradient *funcgrad, double *xi, int N, double *dx, double fsval, double delta,
		int method,int MAXITER,int *niter,double eps,double gtol,double stol,double *xf) {
	int rcode,iter,gfdcode,hdcode;
	int i,siter,retval,fdiff;
	double dt1,dt2,eps2,eps3;
	double fx,num,den,stop0,maxstep,fxf;
	double *jac,*hess,*scheck,*xc,*L,*step;
	double *ioval;
	
	jac = (double*) malloc(sizeof(double) *N);
	scheck = (double*) malloc(sizeof(double) *N);
	xc = (double*) malloc(sizeof(double) *N);
	step = (double*) malloc(sizeof(double) *N);
	hess = (double*) malloc(sizeof(double) *N * N);
	L = (double*) malloc(sizeof(double) *N * N);
	ioval = (double*) malloc(sizeof(double) *8);
	
	/*
	 * Return Codes
	 * 
	 * Codes 1,2,3 denote possible success.
	 * Codes 0 and 4 denote failure.
	 * 
	 * 1 - df(x)/dx <= gtol achieved so xf may be the local minima.
	 * 2 - Distance between the last two steps is less than stol or |xf - xi| <= stol so xf may be the local minima.
	 * 3 - Global Step failed to locate a lower point than xi so xi may be the local minima.
	 * 4 - Iteration Limit exceeded. Convergence not achieved.
	 * 
	 */ 
	
	rcode = 0;
	*niter = 0;
	siter = MAXITER;
	eps3 = pow(eps,(double) 1.0/3.0);
	eps2 = sqrt(eps);
	gfdcode = 0;
	hdcode = 0;
	//set values
	
	if (delta <= 0.0) {
		delta = -1.0;
	}
	ioval[0] = delta;
	for(i = 0; i < N;++i) {
		xi[i] *= dx[i];
		dx[i] = 1.0 / dx[i];
	}
	fx = FUNCPT_EVAL(funcpt, xi, N);
	if (fx >= DBL_MAX || fx <= -DBL_MAX) {
		printf("Program Exiting as the function value exceeds the maximum double value");
		rcode = 15;
	}
	if (fx != fx) {
		printf("Program Exiting as the function returns NaN");
		rcode = 15;
	}
	
	gfdcode = grad_fd(funcpt,funcgrad,xi,N,dx,eps2,jac);
	if (gfdcode == 15) {
		rcode = 15;
	}
	fdiff = 1;
	//grad_cd(funcpt,funcgrad,xi,N,dx,eps3,jac);
	
	maxstep = 1000.0; // Needs to be set at a much higher value proportional to l2 norm of dx
	dt1 = dt2 = 0.0;
	for(i = 0; i < N;++i) {
		dt1 += dx[i] * dx[i];
		dt2 += dx[i] * xi[i] * dx[i] * xi[i];
	}

	dt1 = sqrt(dt1);
	dt2 = sqrt(dt2);
	
	if (dt1 > dt2) {
		maxstep *= dt1;
	} else {
		maxstep *= dt2;
	}
	

	//Check Stop0
	if (fabs(fx) > fabs(fsval)) {
			den = fabs(fx);
	} else {
			den = fabs(fsval);
	}
	for(i = 0; i < N;++i) {
		if (fabs(xi[i]) > 1.0 / fabs(dx[i])) {
			num = fabs(xi[i]);
		} else {
			num = 1.0 / fabs(dx[i]);
		}
		scheck[i] = fabs(jac[i]) * num / den;
	}
	
	stop0 = array_max_abs(scheck,N);
	
	if (stop0 <= gtol * 1e-03) {
		rcode = 1;
		for(i = 0; i < N;++i) {
			xf[i] = xi[i];
		}
		
	}
	
	//hessian_fd(funcpt,xi,N,dx,eps,hess);
	hdcode = hessian_opt(funcpt,funcgrad,xi,N,jac,dx,eps,eps2,hess);
	if (hdcode == 15) {
		rcode = 15;
	}
	
	for(i = 0; i < N;++i) {
		xc[i] = xi[i];
	}
	
	while (rcode == 0 && *niter < siter) {
		*niter = *niter + 1;
		
		modelhess(hess,N,dx,eps,L);
		scale(jac,1,N,-1.0);
		
		linsolve_lower(L,N,jac,step);
		
		scale(jac,1,N,-1.0);
		iter = *niter;
		if (method == 0) {
			retval = trsrch(funcpt,xc,jac,step,N,dx,maxstep,iter,L,hess,stol,ioval,eps,xf);
		} else if (method == 1) {
			retval = trsrch_ddl(funcpt,xc,jac,step,N,dx,maxstep,iter,L,hess,stol,ioval,xf);
		}
		else {
			printf("The program accepts only two method values \n");
			printf("Method 0 : Hook step \n");
			printf("Method 1 : Double Dog Leg Step \n");
			exit(1);
		}
		
		fxf = FUNCPT_EVAL(funcpt, xf, N);
		if (fxf >= DBL_MAX || fxf <= -DBL_MAX) {
			printf("Program Exiting as the function value exceeds the maximum double value");
			rcode = 15;
			break;
		}
		if (fxf != fxf) {
			printf("Program Exiting as the function returns NaN");
			rcode = 15;
			break;
		}

		gfdcode = grad_fd(funcpt,funcgrad,xf,N,dx,eps2,jac);
		if (gfdcode == 15) {
			rcode = 15;
			break;
		}
		//grad_cd(funcpt,funcgrad,xf,N,dx,eps3,jac);
		rcode = stopcheck(fxf,N,xc,xf,jac,dx,fsval,gtol,stol,retval);
		//hessian_fd(funcpt,xf,N,dx,eps,hess);
		hdcode = hessian_opt(funcpt,funcgrad,xf,N,jac,dx,eps,eps2,hess);
		if (hdcode == 15) {
			rcode = 15;
		}
		for(i = 0; i < N;++i) {
			xc[i] = xf[i];
		}
	}
	
	if (rcode == 0 && *niter >= siter) {
		rcode = 4;
	}
	
	for(i = 0; i < N;++i) {
		xi[i] *= dx[i];
		dx[i] = 1.0 / dx[i];
	}
	
	free(ioval);
	free(jac);
	free(hess);
	free(scheck);
	free(xc);
	free(L);
	free(step);
	return rcode;
}